

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

void __thiscall Matrix3f::setSubmatrix2x2(Matrix3f *this,int i0,int j0,Matrix2f *m)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  int j;
  long lVar5;
  bool bVar6;
  
  pfVar2 = this->m_elements + (long)j0 * 3 + (long)i0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    pfVar3 = pfVar2;
    do {
      pfVar1 = Matrix2f::operator()(m,(int)lVar4,(int)lVar5);
      *pfVar3 = *pfVar1;
      lVar5 = lVar5 + 1;
      pfVar3 = pfVar3 + 3;
    } while (lVar5 == 1);
    pfVar2 = pfVar2 + 1;
    bVar6 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar6);
  return;
}

Assistant:

void Matrix3f::setSubmatrix2x2( int i0, int j0, const Matrix2f& m )
{
	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}